

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_read(int hdl,void *buffer,long nbytes)

{
  int iVar1;
  size_t sVar2;
  size_t in_RDX;
  char *in_RSI;
  int in_EDI;
  char *cptr;
  long nread;
  LONGLONG in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  if ((handleTable[in_EDI].last_io_op == 2) &&
     (iVar1 = file_seek(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), iVar1 != 0)) {
    local_4 = 0x74;
  }
  else {
    sVar2 = fread(in_RSI,1,in_RDX,(FILE *)handleTable[in_EDI].fileptr);
    if (sVar2 == 1) {
      if (((*in_RSI == '\0') || (*in_RSI == '\n')) || (*in_RSI == ' ')) {
        local_4 = 0x6b;
      }
      else {
        local_4 = 0x6c;
      }
    }
    else if (sVar2 == in_RDX) {
      handleTable[in_EDI].currentpos = in_RDX + handleTable[in_EDI].currentpos;
      handleTable[in_EDI].last_io_op = 1;
      local_4 = 0;
    }
    else {
      local_4 = 0x6c;
    }
  }
  return local_4;
}

Assistant:

int file_read(int hdl, void *buffer, long nbytes)
/*
  read bytes from the current position in the file
*/
{
    long nread;
    char *cptr;

    if (handleTable[hdl].last_io_op == IO_WRITE)
    {
        if (file_seek(hdl, handleTable[hdl].currentpos))
            return(SEEK_ERROR);
    }
  
    nread = (long) fread(buffer, 1, nbytes, handleTable[hdl].fileptr);

    if (nread == 1)
    {
         cptr = (char *) buffer;

         /* some editors will add a single end-of-file character to a file */
         /* Ignore it if the character is a zero, 10, or 32 */
         if (*cptr == 0 || *cptr == 10 || *cptr == 32)
             return(END_OF_FILE);
         else
             return(READ_ERROR);
    }
    else if (nread != nbytes)
    {
        return(READ_ERROR);
    }

    handleTable[hdl].currentpos += nbytes;
    handleTable[hdl].last_io_op = IO_READ;
    return(0);
}